

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

Abc_Cex_t * Pdr_ManDeriveCexAbs(Pdr_Man_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int nRealPis;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  Pdr_Set_t *pPVar8;
  Abc_Cex_t *pAVar9;
  Pdr_Obl_t *pPVar10;
  Gia_Man_t *p_00;
  Abc_Cex_t *p_01;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  
  if ((p->pPars->fUseAbs != 0) && (pVVar3 = p->vMapPpi2Ff, pVVar3 != (Vec_Int_t *)0x0)) {
    nRealPis = p->pAig->nTruePis;
    if (0 < pVVar3->nSize) {
      piVar4 = pVVar3->pArray;
      pVVar5 = p->vMapFf2Ppi;
      uVar17 = 0;
      do {
        lVar18 = (long)piVar4[uVar17];
        if ((lVar18 < 0) || (pVVar5->nSize <= piVar4[uVar17])) goto LAB_005fb417;
        piVar6 = pVVar5->pArray;
        if (uVar17 != (uint)piVar6[lVar18]) {
          __assert_fail("Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                        ,0x1cf,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
        }
        piVar6[lVar18] = -1;
        uVar17 = uVar17 + 1;
      } while ((long)uVar17 < (long)pVVar3->nSize);
    }
    pVVar3->nSize = 0;
    pPVar10 = p->pQueue;
    if (pPVar10 != (Pdr_Obl_t *)0x0) {
      iVar11 = 0;
      do {
        iVar13 = iVar11;
        pPVar8 = pPVar10->pState;
        lVar18 = (long)pPVar8->nLits;
        if (pPVar8->nLits < pPVar8->nTotal) {
          do {
            if ((int)*(uint *)(&pPVar8->field_0x14 + lVar18 * 4) < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar15 = *(uint *)(&pPVar8->field_0x14 + lVar18 * 4) >> 1;
            if (nRealPis <= (int)uVar15) {
              uVar15 = uVar15 - nRealPis;
              if (((int)uVar15 < 0) || (p->vMapFf2Ppi->nSize <= (int)uVar15)) goto LAB_005fb417;
              piVar4 = p->vMapFf2Ppi->pArray;
              if (piVar4[uVar15] < 0) {
                pVVar3 = p->vMapPpi2Ff;
                piVar4[uVar15] = pVVar3->nSize;
                Vec_IntPush(pVVar3,uVar15);
                pPVar8 = pPVar10->pState;
              }
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < pPVar8->nTotal);
        }
        pPVar10 = pPVar10->pNext;
        iVar11 = iVar13 + 1;
      } while (pPVar10 != (Pdr_Obl_t *)0x0);
      pVVar3 = p->vMapPpi2Ff;
      iVar11 = pVVar3->nSize;
      if (iVar11 != 0) {
        if (p->pPars->fUseSimpleRef != 0) {
          if (0 < iVar11) {
            piVar4 = pVVar3->pArray;
            pVVar5 = p->vAbsFlops;
            lVar18 = 0;
            do {
              lVar19 = (long)piVar4[lVar18];
              if ((lVar19 < 0) || (pVVar5->nSize <= piVar4[lVar18])) {
LAB_005fb417:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar6 = pVVar5->pArray;
              if (piVar6[lVar19] != 0) {
                __assert_fail("Vec_IntEntry(p->vAbsFlops, Flop) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                              ,0x1ea,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
              }
              piVar6[lVar19] = 1;
              lVar18 = lVar18 + 1;
            } while (lVar18 < pVVar3->nSize);
          }
LAB_005fb3d8:
          uVar1 = p->nCexes;
          uVar2 = p->nCexesTotal;
          p->nCexes = uVar1 + 1;
          p->nCexesTotal = uVar2 + 1;
          return (Abc_Cex_t *)0x0;
        }
        pAVar9 = Abc_CexAlloc(p->pAig->nRegs - iVar11,iVar11 + p->pAig->nTruePis,iVar13 + 1);
        pAVar9->iPo = p->iOutCur;
        pAVar9->iFrame = iVar13;
        pPVar10 = p->pQueue;
        if (pPVar10 != (Pdr_Obl_t *)0x0) {
          iVar11 = 0;
          do {
            iVar7 = iVar11;
            pPVar8 = pPVar10->pState;
            lVar18 = (long)pPVar8->nLits;
            if (pPVar8->nLits < pPVar8->nTotal) {
              do {
                uVar15 = *(uint *)(&pPVar8->field_0x14 + lVar18 * 4);
                if ((int)uVar15 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x130,"int Abc_LitIsCompl(int)");
                }
                if ((uVar15 & 1) == 0) {
                  uVar15 = uVar15 >> 1;
                  if ((int)uVar15 < nRealPis) {
                    iVar11 = uVar15 + pAVar9->nRegs + pAVar9->nPis * iVar7;
                  }
                  else {
                    uVar15 = uVar15 - nRealPis;
                    if (((int)uVar15 < 0) || (p->vMapFf2Ppi->nSize <= (int)uVar15))
                    goto LAB_005fb417;
                    iVar11 = p->vMapFf2Ppi->pArray[uVar15] + nRealPis;
                    if (pAVar9->nPis <= iVar11) {
                      __assert_fail("iPPI < pCex->nPis",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                                    ,0x200,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
                    }
                    iVar11 = pAVar9->nPis * iVar7 + iVar11 + pAVar9->nRegs;
                  }
                  (&pAVar9[1].iPo)[iVar11 >> 5] =
                       (&pAVar9[1].iPo)[iVar11 >> 5] | 1 << ((byte)iVar11 & 0x1f);
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 < pPVar8->nTotal);
            }
            pPVar10 = pPVar10->pNext;
            iVar11 = iVar7 + 1;
          } while (pPVar10 != (Pdr_Obl_t *)0x0);
          if (iVar7 == iVar13) {
            p_00 = Gia_ManDupAbs(p->pGia,p->vMapPpi2Ff,p->vMapFf2Ppi);
            iVar11 = 0;
            p_01 = Bmc_CexCareMinimizeAig(p_00,nRealPis,pAVar9,1,0,0);
            Gia_ManStop(p_00);
            if (p_01->nPis != pAVar9->nPis) {
              __assert_fail("pCexCare->nPis == pCex->nPis",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                            ,0x209,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
            }
            Abc_CexFree(pAVar9);
            iVar7 = p_01->nPis;
            iVar16 = iVar7;
            iVar12 = 0;
            do {
              if (nRealPis < iVar16) {
                lVar18 = 0;
                do {
                  iVar14 = (int)lVar18;
                  uVar15 = iVar16 * iVar12 + p_01->nRegs + nRealPis + iVar14;
                  if (((uint)(&p_01[1].iPo)[(int)uVar15 >> 5] >> (uVar15 & 0x1f) & 1) != 0) {
                    if ((iVar14 < 0) || (p->vMapPpi2Ff->nSize <= iVar14)) goto LAB_005fb417;
                    iVar16 = p->vMapPpi2Ff->pArray[lVar18];
                    lVar19 = (long)iVar16;
                    if ((lVar19 < 0) || (p->vAbsFlops->nSize <= iVar16)) goto LAB_005fb417;
                    piVar4 = p->vAbsFlops->pArray;
                    if (piVar4[lVar19] == 0) {
                      piVar4[lVar19] = 1;
                      iVar11 = iVar11 + 1;
                      iVar7 = p_01->nPis;
                    }
                  }
                  lVar18 = lVar18 + 1;
                  iVar16 = iVar7;
                } while (nRealPis + (int)lVar18 < iVar7);
              }
              bVar20 = iVar12 != iVar13;
              iVar12 = iVar12 + 1;
            } while (bVar20);
            Abc_CexFree(p_01);
            if (iVar11 == 0) goto LAB_005fb401;
            goto LAB_005fb3d8;
          }
        }
        __assert_fail("f == nFrames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                      ,0x204,"Abc_Cex_t *Pdr_ManDeriveCexAbs(Pdr_Man_t *)");
      }
    }
  }
LAB_005fb401:
  pAVar9 = Pdr_ManDeriveCex(p);
  return pAVar9;
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCexAbs( Pdr_Man_t * p )
{
    extern Gia_Man_t * Gia_ManDupAbs( Gia_Man_t * p, Vec_Int_t * vMapPpi2Ff, Vec_Int_t * vMapFf2Ppi );

    Gia_Man_t * pAbs;
    Abc_Cex_t * pCex, * pCexCare;
    Pdr_Obl_t * pObl;
    int i, f, Lit, Flop, nFrames = 0;
    int nPis = Saig_ManPiNum(p->pAig);
    int nFfRefined = 0;
    if ( !p->pPars->fUseAbs || !p->vMapPpi2Ff )
        return Pdr_ManDeriveCex(p);
    // restore previous map
    Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
    {
        assert( Vec_IntEntry( p->vMapFf2Ppi, Flop ) == i );
        Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, -1 );
    }
    Vec_IntClear( p->vMapPpi2Ff );
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
    {
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i]; 
            if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                continue;
            Flop = Abc_Lit2Var(Lit) - nPis;
            if ( Vec_IntEntry(p->vMapFf2Ppi, Flop) >= 0 ) // already used PPI literal
                continue;
            Vec_IntWriteEntry( p->vMapFf2Ppi, Flop, Vec_IntSize(p->vMapPpi2Ff) );
            Vec_IntPush( p->vMapPpi2Ff, Flop );
        }
        nFrames++;
    }
    if ( Vec_IntSize(p->vMapPpi2Ff) == 0 ) // no PPIs -- this is a real CEX
        return Pdr_ManDeriveCex(p);
    if ( p->pPars->fUseSimpleRef )
    {
        // rely on ternary simulation to perform refinement
        Vec_IntForEachEntry( p->vMapPpi2Ff, Flop, i )
        {
            assert( Vec_IntEntry(p->vAbsFlops, Flop) == 0 );
            Vec_IntWriteEntry( p->vAbsFlops, Flop, 1 );
            nFfRefined++;
        }
    }
    else
    {
        // create the counter-example
        pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig) - Vec_IntSize(p->vMapPpi2Ff), Saig_ManPiNum(p->pAig) + Vec_IntSize(p->vMapPpi2Ff), nFrames );
        pCex->iPo    = p->iOutCur;
        pCex->iFrame = nFrames-1;
        for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
            for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
            {
                Lit = pObl->pState->Lits[i];
                if ( Abc_LitIsCompl(Lit) )
                    continue;
                if ( Abc_Lit2Var(Lit) < nPis ) // PI literal
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
                else
                {
                    int iPPI = nPis + Vec_IntEntry(p->vMapFf2Ppi, Abc_Lit2Var(Lit) - nPis);
                    assert( iPPI < pCex->nPis );
                    Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + iPPI );
                }
            }
        assert( f == nFrames );
        // perform CEX minimization
        pAbs = Gia_ManDupAbs( p->pGia, p->vMapPpi2Ff, p->vMapFf2Ppi );
        pCexCare = Bmc_CexCareMinimizeAig( pAbs, nPis, pCex, 1, 0, 0 );
        Gia_ManStop( pAbs );
        assert( pCexCare->nPis == pCex->nPis );
        Abc_CexFree( pCex );
        // detect care PPIs
        for ( f = 0; f < nFrames; f++ )
        {
            for ( i = nPis; i < pCexCare->nPis; i++ )
                if ( Abc_InfoHasBit(pCexCare->pData, pCexCare->nRegs + pCexCare->nPis * f + i) )
                {
                    if ( Vec_IntEntry(p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis)) == 0 ) // currently abstracted
                        Vec_IntWriteEntry( p->vAbsFlops, Vec_IntEntry(p->vMapPpi2Ff, i-nPis), 1 ), nFfRefined++;
                }
        }
        Abc_CexFree( pCexCare );
        if ( nFfRefined == 0 ) // no refinement -- this is a real CEX
            return Pdr_ManDeriveCex(p);
    }
    //printf( "CEX-based refinement refined %d flops.\n", nFfRefined );
    p->nCexesTotal++;
    p->nCexes++;
    return NULL;
}